

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O2

FArchive * operator<<(FArchive *arc,FDoorAnimation **Doorani)

{
  FDoorAnimation *pFVar1;
  FTextureID tex;
  FTextureID local_1c;
  
  if (arc->m_Storing == true) {
    operator<<(arc,&(*Doorani)->BaseTexture);
  }
  else {
    operator<<(arc,&local_1c);
    pFVar1 = FTextureManager::FindAnimatedDoor(&TexMan,local_1c);
    *Doorani = pFVar1;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FDoorAnimation* &Doorani)
{
	if (arc.IsStoring())
	{
		arc << Doorani->BaseTexture;
	}
	else
	{
		FTextureID tex;
		arc << tex;
		Doorani = TexMan.FindAnimatedDoor(tex);
	}
	return arc;
}